

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O0

void __thiscall
mxx::sync_basic_ostream<char,_std::char_traits<char>_>::sync_basic_ostream
          (sync_basic_ostream<char,_std::char_traits<char>_> *this,comm *comm,int root)

{
  _func_int *p_Var1;
  int iVar2;
  stringbuf *this_00;
  int root_local;
  comm *comm_local;
  sync_basic_ostream<char,_std::char_traits<char>_> *this_local;
  
  std::ios::ios((ios *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x28);
  std::ostream::ostream(this);
  (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream =
       (_func_int **)&PTR__sync_basic_ostream_00295ce8;
  *(undefined ***)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x28 =
       &PTR__sync_basic_ostream_00295d10;
  *(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8 = comm;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10 = 0;
  *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 = root;
  this_00 = (stringbuf *)operator_new(0x68);
  std::__cxx11::stringbuf::stringbuf(this_00);
  std::unique_ptr<std::__cxx11::stringbuf,std::default_delete<std::__cxx11::stringbuf>>::
  unique_ptr<std::default_delete<std::__cxx11::stringbuf>,void>
            ((unique_ptr<std::__cxx11::stringbuf,std::default_delete<std::__cxx11::stringbuf>> *)
             &(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20,(pointer)this_00
            );
  if (-1 < root) {
    iVar2 = mxx::comm::size(comm);
    if (root < iVar2) goto LAB_001fb40a;
  }
  assert_fail("0 <= root && root < comm.size()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/stream.hpp"
              ,0x36,"sync_basic_ostream");
LAB_001fb40a:
  iVar2 = mxx::comm::rank(comm);
  if (root == iVar2) {
    assert_fail("root != comm.rank()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/stream.hpp"
                ,0x37,"sync_basic_ostream");
  }
  p_Var1 = (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream[-3];
  std::
  unique_ptr<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get((unique_ptr<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20);
  std::ios::rdbuf((streambuf *)
                  ((long)&(this->super_basic_ostream<char,_std::char_traits<char>_>).
                          _vptr_basic_ostream + (long)p_Var1));
  return;
}

Assistant:

sync_basic_ostream(const mxx::comm& comm, int root) : m_comm(comm), m_stream(nullptr), m_root(root), m_buf(new strbuf_t()) {
        MXX_ASSERT(0 <= root && root < comm.size());
        MXX_ASSERT(root != comm.rank()); // the root node can't have a null stream
        this->rdbuf(m_buf.get());
    }